

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O1

void __thiscall
JetHead::vector<Regex::GroupData>::resize(vector<Regex::GroupData> *this,uint newSize)

{
  long *plVar1;
  GroupData *pGVar2;
  ulong uVar3;
  ulong uVar4;
  long *plVar5;
  uint newSize_00;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  uVar3 = (ulong)newSize;
  if (this->mAllocated < newSize) {
    newSize_00 = 0;
    if (this->mAllocated * 2 <= newSize) {
      newSize_00 = newSize;
    }
    sizeup(this,newSize_00);
  }
  uVar4 = (ulong)this->mSize;
  if (newSize < this->mSize) {
    lVar6 = uVar3 * 0x28 + 0x18;
    uVar7 = uVar3;
    do {
      plVar1 = *(long **)((long)this->mData + lVar6 + -0x10);
      plVar5 = (long *)((long)&this->mData->start_pos + lVar6);
      if (plVar5 != plVar1) {
        operator_delete(plVar1,*plVar5 + 1);
      }
      uVar7 = uVar7 + 1;
      uVar4 = (ulong)this->mSize;
      lVar6 = lVar6 + 0x28;
    } while (uVar7 < uVar4);
  }
  if ((uint)uVar4 < newSize) {
    lVar6 = uVar4 * 0x28 + 0x18;
    lVar8 = uVar3 - uVar4;
    do {
      pGVar2 = this->mData;
      *(undefined8 *)((long)pGVar2 + lVar6 + -0x18) = 0;
      *(long *)((long)pGVar2 + lVar6 + -0x10) = (long)&pGVar2->start_pos + lVar6;
      *(undefined8 *)((long)pGVar2 + lVar6 + -8) = 0;
      *(undefined1 *)((long)&pGVar2->start_pos + lVar6) = 0;
      lVar6 = lVar6 + 0x28;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  this->mSize = newSize;
  return;
}

Assistant:

void resize(unsigned newSize)
		{
			// If we need more allocation, do it now
			if (mAllocated < newSize)
			{
				if (newSize < mAllocated * 2)
				{
					sizeup();
				} else {
					sizeup(newSize);
				}
			}

			// If we are shrinking (newSize < mSize), destroy
			// everything that is now off the end of the vector
			for (unsigned i = newSize; i < mSize; i++)
			{
				mData[i].~T();
			}

			// If we are growing (mSize < newSize), then call the
			// default constructor on all the objects we just 
			// implicitly created
			for (unsigned i = mSize; i < newSize; i++)
			{
				new(mData + i) T();
			}
			
			// Remember our new size
			mSize = newSize;
		}